

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O0

shared_ptr<nuraft::buffer> * __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::get
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  unique_lock<std::mutex> *local_8;
  
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffc8);
  if (((ulong)((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&in_RDI[3]._M_device)->
              _M_ptr & 0x100000000) == 0) {
    std::condition_variable::wait((unique_lock *)(in_RDI + 10));
    bVar1 = std::operator==((shared_ptr<std::exception> *)in_RDI,in_stack_ffffffffffffffc8);
    local_8 = in_RDI;
    if (bVar1) {
      local_8 = in_RDI + 1;
    }
  }
  else {
    bVar1 = std::operator==((shared_ptr<std::exception> *)in_RDI,in_stack_ffffffffffffffc8);
    local_8 = in_RDI;
    if (bVar1) {
      local_8 = in_RDI + 1;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  return (shared_ptr<nuraft::buffer> *)local_8;
}

Assistant:

T& get() {
        std::unique_lock<std::mutex> lock(lock_);
        if (has_result_) {
            if (err_ == nullptr) {
                return result_;
            }
            // Return empty result rather than throw exception.
            // Caller should handle it properly.
            return empty_result_;
        }

        cv_.wait(lock);
        if (err_ == nullptr) {
            return result_;
        }

        return empty_result_;
    }